

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

SourceFileHandleT __thiscall
cmQtAutoMocUic::JobEvaluateT::MocFindIncludedHeader
          (JobEvaluateT *this,string *includerDir,string *includeBase)

{
  cmWorkerPool **this_00;
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  SourceFileHandleT *res;
  string *psVar3;
  SourceFileHandleT SVar4;
  string testPath;
  
  std::operator+(&testPath,includeBase,in_RCX);
  MocFindHeader(this,includerDir);
  std::__cxx11::string::~string((string *)&testPath);
  _Var2._M_pi = extraout_RDX;
  if ((this->super_JobFenceT).super_JobT.super_JobT._vptr_JobT == (_func_int **)0x0) {
    this_00 = &(this->super_JobFenceT).super_JobT.super_JobT.Pool_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
    psVar1 = *(string **)(*(long *)includerDir->_M_string_length + 0x340);
    _Var2._M_pi = extraout_RDX_00;
    for (psVar3 = *(string **)(*(long *)includerDir->_M_string_length + 0x338); psVar3 != psVar1;
        psVar3 = psVar3 + 0x20) {
      std::__cxx11::string::string((string *)&testPath,psVar3);
      std::__cxx11::string::push_back((char)&testPath);
      std::__cxx11::string::append((string *)&testPath);
      MocFindHeader(this,includerDir);
      if ((this->super_JobFenceT).super_JobT.super_JobT._vptr_JobT != (_func_int **)0x0) {
        std::__cxx11::string::~string((string *)&testPath);
        _Var2._M_pi = extraout_RDX_02;
        goto LAB_00181000;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
      std::__cxx11::string::~string((string *)&testPath);
      _Var2._M_pi = extraout_RDX_01;
    }
    (this->super_JobFenceT).super_JobT.super_JobT._vptr_JobT = (_func_int **)0x0;
    (this->super_JobFenceT).super_JobT.super_JobT.Pool_ = (cmWorkerPool *)0x0;
  }
LAB_00181000:
  SVar4.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  SVar4.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SourceFileHandleT)
         SVar4.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmQtAutoMocUic::SourceFileHandleT
cmQtAutoMocUic::JobEvaluateT::MocFindIncludedHeader(
  std::string const& includerDir, std::string const& includeBase) const
{
  // Search in vicinity of the source
  {
    SourceFileHandleT res = MocFindHeader(includerDir + includeBase);
    if (res) {
      return res;
    }
  }
  // Search in include directories
  for (std::string const& path : MocConst().IncludePaths) {
    std::string testPath = path;
    testPath += '/';
    testPath += includeBase;
    SourceFileHandleT res = MocFindHeader(testPath);
    if (res) {
      return res;
    }
  }
  // Return without success
  return SourceFileHandleT();
}